

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hextile.hpp
# Opt level: O0

void __thiscall
hextile::HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>::__introspect
          (HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_> *this,size_t off)

{
  ostream *poVar1;
  reference this_00;
  ulong local_58;
  size_t i;
  allocator local_39;
  string local_38 [32];
  size_t local_18;
  size_t off_local;
  HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_> *this_local;
  
  local_18 = off;
  off_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,off,' ',&local_39);
  poVar1 = std::operator<<((ostream *)&std::cout,local_38);
  poVar1 = std::operator<<(poVar1,"HexTile[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_y);
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  for (local_58 = 0; local_58 < this->_x * this->_y; local_58 = local_58 + 1) {
    this_00 = std::vector<gamespace::BoardTile,_std::allocator<gamespace::BoardTile>_>::operator[]
                        (&this->_data,local_58);
    gamespace::BoardTile::__introspect(this_00,local_18 + 2);
  }
  return;
}

Assistant:

void __introspect(size_t off) {
            std::cout << std::string(off, ' ') << "HexTile[" << _x << "," << _y << "]" << std::endl;
            for(size_t i = 0; i < _x * _y; ++i)
                _data[i].__introspect(off + 2);
        }